

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

uint32_t __thiscall spoa::Graph::Node::Coverage(Node *this)

{
  pointer ppEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t uVar4;
  ulong in_R8;
  Edge **it_1;
  pointer ppEVar5;
  Edge **it;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  labels;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  ppEVar1 = (this->inedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar5 = (this->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar1; ppEVar5 = ppEVar5 + 1
      ) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_R8;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int*,std::insert_iterator<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               ((*ppEVar5)->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
               ((*ppEVar5)->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_58,
               (insert_iterator<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
                )(auVar2 << 0x40));
  }
  ppEVar1 = (this->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar5 = (this->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar1; ppEVar5 = ppEVar5 + 1
      ) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_R8;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int*,std::insert_iterator<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               ((*ppEVar5)->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
               ((*ppEVar5)->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_58,
               (insert_iterator<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
                )(auVar3 << 0x40));
  }
  uVar4 = (uint32_t)local_58._M_element_count;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return uVar4;
}

Assistant:

std::uint32_t Graph::Node::Coverage() const {
  std::unordered_set<std::uint32_t> labels;
  for (const auto& it : inedges) {
    std::copy(
        it->labels.begin(),
        it->labels.end(),
        std::inserter(labels, labels.end()));
  }
  for (const auto& it : outedges) {
    std::copy(
        it->labels.begin(),
        it->labels.end(),
        std::inserter(labels, labels.end()));
  }
  return labels.size();
}